

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::BindImage
          (GLContextState *this,Uint32 Index,TextureViewGLImpl *pTexView,GLint MipLevel,
          GLboolean IsLayered,GLint Layer,GLenum Access,GLenum Format)

{
  bool bVar1;
  Int32 _UniqueID;
  GLuint _GLHandle;
  GLTextureObj *this_00;
  size_type sVar2;
  reference pvVar3;
  Char *Message;
  undefined1 local_70 [8];
  string msg;
  undefined1 auStack_48 [4];
  GLenum err;
  BoundImageInfo NewImageInfo;
  GLint Layer_local;
  GLboolean IsLayered_local;
  GLint MipLevel_local;
  TextureViewGLImpl *pTexView_local;
  Uint32 Index_local;
  GLContextState *this_local;
  
  NewImageInfo.Access = Layer;
  NewImageInfo.Format._3_1_ = IsLayered;
  _UniqueID = DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                             *)pTexView);
  this_00 = TextureViewGLImpl::GetHandle(pTexView);
  _GLHandle = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this_00)
  ;
  BoundImageInfo::BoundImageInfo
            ((BoundImageInfo *)auStack_48,_UniqueID,_GLHandle,MipLevel,NewImageInfo.Format._3_1_,
             NewImageInfo.Access,Access,Format);
  sVar2 = std::
          vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
          ::size(&this->m_BoundImages);
  if (sVar2 <= Index) {
    std::
    vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
    ::resize(&this->m_BoundImages,(ulong)Index + 1);
  }
  pvVar3 = std::
           vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
           ::operator[](&this->m_BoundImages,(ulong)Index);
  bVar1 = BoundImageInfo::operator!=(pvVar3,(BoundImageInfo *)auStack_48);
  if (bVar1) {
    pvVar3 = std::
             vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
             ::operator[](&this->m_BoundImages,(ulong)Index);
    pvVar3->InterfaceID = (UniqueIdentifier)auStack_48;
    pvVar3->GLHandle = err;
    *(undefined8 *)&pvVar3->MipLevel = NewImageInfo._0_8_;
    *(undefined8 *)&pvVar3->Layer = NewImageInfo._8_8_;
    pvVar3->Format = NewImageInfo.Layer;
    (*__glewBindImageTexture)
              (Index,err,MipLevel,NewImageInfo.Format._3_1_,NewImageInfo.Access,Access,Format);
    msg.field_2._12_4_ = glGetError();
    if (msg.field_2._12_4_ != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"BindImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x120,(char (*) [28])"glBindImageTexture() failed",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_70,(char (*) [6])0xe8e72e);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"BindImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x120);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void GLContextState::BindImage(Uint32             Index,
                               TextureViewGLImpl* pTexView,
                               GLint              MipLevel,
                               GLboolean          IsLayered,
                               GLint              Layer,
                               GLenum             Access,
                               GLenum             Format)
{
#if GL_ARB_shader_image_load_store
    BoundImageInfo NewImageInfo //
        {
            pTexView->GetUniqueID(),
            pTexView->GetHandle(),
            MipLevel,
            IsLayered,
            Layer,
            Access,
            Format //
        };
    if (Index >= m_BoundImages.size())
        m_BoundImages.resize(size_t{Index} + 1);
    if (m_BoundImages[Index] != NewImageInfo)
    {
        m_BoundImages[Index] = NewImageInfo;
        glBindImageTexture(Index, NewImageInfo.GLHandle, MipLevel, IsLayered, Layer, Access, Format);
        DEV_CHECK_GL_ERROR("glBindImageTexture() failed");
    }
#else
    UNSUPPORTED("GL_ARB_shader_image_load_store is not supported");
#endif
}